

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::resize
          (PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *this,Index size)

{
  long *plVar1;
  undefined8 *puVar2;
  
  if (size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/PlainObjectBase.h"
                  ,0x10c,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<long, -1, 1, 0, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<long, -1, 1, 0, -1, 1>]"
                 );
  }
  if ((this->m_storage).m_rows != size) {
    free((this->m_storage).m_data);
    if (size == 0) {
      plVar1 = (long *)0x0;
    }
    else {
      if ((ulong)size >> 0x3d != 0) {
LAB_0010830f:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = operator_delete;
        __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      plVar1 = (long *)malloc(size * 8);
      if (plVar1 == (long *)0x0) goto LAB_0010830f;
    }
    (this->m_storage).m_data = plVar1;
  }
  (this->m_storage).m_rows = size;
  return;
}

Assistant:

inline void resize(Index size)
    {
      EIGEN_STATIC_ASSERT_VECTOR_ONLY(PlainObjectBase)
      eigen_assert(((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0);
      #ifdef EIGEN_INITIALIZE_COEFFS
        bool size_changed = size != this->size();
      #endif
      if(RowsAtCompileTime == 1)
        m_storage.resize(size, 1, size);
      else
        m_storage.resize(size, size, 1);
      #ifdef EIGEN_INITIALIZE_COEFFS
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #endif
    }